

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

GCObject ** sweeplist(lua_State *L,GCObject **p,lu_mem count)

{
  lu_int32 *plVar1;
  byte bVar2;
  byte bVar3;
  GCObject *L1;
  bool bVar4;
  byte bVar5;
  Node *osize;
  long lVar6;
  bool bVar7;
  
  bVar2 = L->l_G->currentwhite;
  bVar7 = L->l_G->gckind == '\x02';
  bVar5 = 0x40;
  if (!bVar7) {
    bVar5 = bVar2 & 3;
  }
  lVar6 = count + 1;
  do {
    L1 = ((lua_State *)p)->next;
    if (L1 == (GCObject *)0x0) {
      return (GCObject **)0x0;
    }
    lVar6 = lVar6 + -1;
    if (lVar6 == 0) {
      return &((lua_State *)p)->next;
    }
    bVar3 = (L1->gch).marked;
    if ((byte)((bVar3 ^ 3) & (bVar2 ^ 3)) != 0) {
      if ((bVar7 << 6 & bVar3) != 0) {
        bVar4 = false;
        goto switchD_00109df0_caseD_b;
      }
      if (((L1->gch).tt == '\b') && ((L1->p).upvalues != (Upvaldesc *)0x0)) {
        sweeplist(L,&(L1->th).openupval,0xfffffffffffffffd);
        luaE_freeCI((lua_State *)L1);
        if (L->l_G->gckind != '\x01') {
          luaD_shrinkstack((lua_State *)L1);
        }
      }
      (L1->gch).marked = bVar3 & (-bVar7 | 0xb8U) | bVar5;
      bVar4 = true;
      p = (GCObject **)L1;
      goto LAB_00109ec8;
    }
    ((lua_State *)p)->next = (L1->gch).next;
    bVar4 = true;
    switch((L1->gch).tt) {
    case '\x04':
      plVar1 = &(L->l_G->strt).nuse;
      *plVar1 = *plVar1 - 1;
    case '\x14':
      osize = (Node *)((long)&(L1->h).array[1].tt_ + 1);
LAB_00109eb6:
      luaM_realloc_(L,L1,(size_t)osize,0);
      break;
    case '\x05':
      luaH_free(L,(Table *)L1);
      break;
    case '\x06':
      osize = (Node *)((ulong)(L1->h).flags * 8 + 0x20);
      goto LAB_00109eb6;
    case '\a':
      osize = (L1->h).lastfree + 1;
      goto LAB_00109eb6;
    case '\b':
      luaE_freethread(L,&L1->th);
      break;
    case '\t':
      luaF_freeproto(L,(Proto *)L1);
      break;
    case '\n':
      luaF_freeupval(L,(UpVal *)L1);
      break;
    case '\v':
    case '\f':
    case '\r':
    case '\x0e':
    case '\x0f':
    case '\x10':
    case '\x11':
    case '\x12':
    case '\x13':
      break;
    default:
      if ((L1->gch).tt == '&') {
        osize = (Node *)((ulong)(L1->h).flags * 0x10 + 0x20);
        goto LAB_00109eb6;
      }
    }
switchD_00109df0_caseD_b:
LAB_00109ec8:
    if (!bVar4) {
      return (GCObject **)0x0;
    }
  } while( true );
}

Assistant:

static GCObject **sweeplist (lua_State *L, GCObject **p, lu_mem count) {
  global_State *g = G(L);
  int ow = otherwhite(g);
  int toclear, toset;  /* bits to clear and to set in all live objects */
  int tostop;  /* stop sweep when this is true */
  if (isgenerational(g)) {  /* generational mode? */
    toclear = ~0;  /* clear nothing */
    toset = bitmask(OLDBIT);  /* set the old bit of all surviving objects */
    tostop = bitmask(OLDBIT);  /* do not sweep old generation */
  }
  else {  /* normal mode */
    toclear = maskcolors;  /* clear all color bits + old bit */
    toset = luaC_white(g);  /* make object white */
    tostop = 0;  /* do not stop */
  }
  while (*p != NULL && count-- > 0) {
    GCObject *curr = *p;
    int marked = gch(curr)->marked;
    if (isdeadm(ow, marked)) {  /* is 'curr' dead? */
      *p = gch(curr)->next;  /* remove 'curr' from list */
      freeobj(L, curr);  /* erase 'curr' */
    }
    else {
      if (testbits(marked, tostop))
        return NULL;  /* stop sweeping this list */
      if (gch(curr)->tt == LUA_TTHREAD)
        sweepthread(L, gco2th(curr));  /* sweep thread's upvalues */
      /* update marks */
      gch(curr)->marked = cast_byte((marked & toclear) | toset);
      p = &gch(curr)->next;  /* go to next element */
    }
  }
  return (*p == NULL) ? NULL : p;
}